

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

void do_load_sel_object_search_proc(Am_Object *cmd)

{
  anon_union_8_8_ea4c8939_for_value aVar1;
  bool bVar2;
  bool bVar3;
  Am_Value *pAVar4;
  Am_Value *pAVar5;
  Am_Wrapper *in_value;
  Am_Slot_Key key;
  Am_Object item;
  Am_Object selected;
  Am_Assoc as;
  Am_Value_List slots_to_item;
  Am_Object search_widget;
  Am_Object sel_widget;
  Am_Value v;
  Am_Value_List slots_to_save;
  Am_Value_List sel_list;
  Am_Object local_b0;
  Am_Value local_a8;
  Am_Object local_98;
  Am_Assoc local_90;
  Am_Value_List local_88;
  Am_Object local_78;
  Am_Object local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  Am_Object::Get_Object((Am_Object *)&local_88,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_78,(Am_Slot_Key)&local_88,10);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  pAVar4 = Am_Object::Get(&local_78,0x197,0);
  Am_Object::Am_Object(&local_70,pAVar4);
  pAVar4 = Am_Object::Get(&local_78,Am_SLOTS_TO_ITEMS,0);
  Am_Value_List::Am_Value_List(&local_88,pAVar4);
  pAVar4 = Am_Object::Get(&local_70,0x169,0);
  Am_Value_List::Am_Value_List(&local_40,pAVar4);
  pAVar4 = Am_Value_List::Get_First(&local_40);
  Am_Object::Am_Object(&local_98,pAVar4);
  pAVar4 = Am_Object::Get(&local_98,0xb8,0);
  Am_Value_List::Am_Value_List(&local_50,pAVar4);
  local_90.data = (Am_Assoc_Data *)0x0;
  local_b0.data = (Am_Object_Data *)0x0;
  local_68._8_2_ = 0;
  local_58 = 0;
  Am_Value_List::Start(&local_88);
  pAVar4 = (Am_Value *)(local_68 + 8);
  do {
    bVar2 = Am_Value_List::Last(&local_88);
    if (bVar2) {
      Am_Value::~Am_Value((Am_Value *)(local_68 + 8));
      Am_Object::~Am_Object(&local_b0);
      Am_Assoc::~Am_Assoc(&local_90);
      Am_Value_List::~Am_Value_List(&local_50);
      Am_Object::~Am_Object(&local_98);
      Am_Value_List::~Am_Value_List(&local_40);
      Am_Value_List::~Am_Value_List(&local_88);
      Am_Object::~Am_Object(&local_70);
      Am_Object::~Am_Object(&local_78);
      return;
    }
    pAVar5 = Am_Value_List::Get(&local_88);
    Am_Assoc::operator=(&local_90,pAVar5);
    if (local_90.data == (Am_Assoc_Data *)0x0) {
      Am_Error("Accessing (nullptr) Assoc");
    }
    Am_Value::Am_Value(&local_a8,&(local_90.data)->value_1);
    aVar1 = local_a8.value;
    if ((2 < local_a8.type - 1) && (local_a8.type != 0x4015)) {
      Am_Error();
    }
    Am_Value::~Am_Value(&local_a8);
    key = (Am_Slot_Key)aVar1.long_value;
    if (key == 0xb) {
      Am_Object::Get_Prototype((Am_Object *)&local_a8);
      in_value = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_a8);
      Am_Value::operator=(pAVar4,in_value);
      Am_Object::~Am_Object((Am_Object *)&local_a8);
      bVar2 = true;
    }
    else {
      local_a8.value.long_value = aVar1.long_value & 0xffff;
      local_a8.type = 0x4015;
      bVar2 = Am_Value_List::Start_Member(&local_50,&local_a8);
      Am_Value::~Am_Value(&local_a8);
      if (bVar2) {
        pAVar5 = Am_Object::Get(&local_98,key,1);
        Am_Value::operator=(pAVar4,pAVar5);
        bVar3 = Am_Value::Exists(pAVar4);
        bVar2 = true;
        if (!bVar3) {
          Am_Value::operator=(pAVar4,0);
        }
      }
      else {
        pAVar5 = Am_Object::Get(&local_98,key,1);
        Am_Value::operator=(pAVar4,pAVar5);
        bVar2 = false;
      }
    }
    if (local_90.data == (Am_Assoc_Data *)0x0) {
      Am_Error("Accessing (nullptr) Assoc");
    }
    Am_Value::Am_Value(&local_a8,&(local_90.data)->value_2);
    Am_Object::operator=(&local_b0,&local_a8);
    Am_Value::~Am_Value(&local_a8);
    bVar3 = Am_Value::Exists(pAVar4);
    pAVar5 = &local_a8;
    if (bVar3) {
      Am_Object::Get_Object((Am_Object *)&local_a8,(Am_Slot_Key)&local_b0,(ulong)Am_USE_ITEM);
      Am_Object::Set((Am_Object *)&local_a8,0x169,bVar2,0);
      Am_Object::~Am_Object((Am_Object *)&local_a8);
      if (key == 0xb) {
        Am_Object::Am_Object((Am_Object *)local_68,pAVar4);
        set_type_of_search(&local_b0,(Am_Object *)local_68);
        pAVar5 = (Am_Value *)local_68;
      }
      else {
        Am_Object::Get_Object((Am_Object *)&local_a8,(Am_Slot_Key)&local_b0,(ulong)Am_ITEM_VALUE);
        Am_Object::Set((Am_Object *)&local_a8,0x169,pAVar4,0);
        Am_Object::~Am_Object((Am_Object *)&local_a8);
        Am_Object::Get_Object((Am_Object *)&local_a8,(Am_Slot_Key)&local_b0,(ulong)Am_ITEM_VALUE);
        Am_Object::Set((Am_Object *)&local_a8,0xfa,pAVar4,0);
      }
LAB_00211cb3:
      Am_Object::~Am_Object((Am_Object *)pAVar5);
    }
    else {
      Am_Object::Get_Object((Am_Object *)&local_a8,(Am_Slot_Key)&local_b0,(ulong)Am_USE_ITEM);
      Am_Object::Set((Am_Object *)&local_a8,0x169,false,0);
      Am_Object::~Am_Object((Am_Object *)&local_a8);
      if (key != 0xb) {
        Am_Object::Get_Object((Am_Object *)&local_a8,(Am_Slot_Key)&local_b0,(ulong)Am_ITEM_VALUE);
        Am_Object::Set((Am_Object *)&local_a8,0x169,"",0);
        goto LAB_00211cb3;
      }
    }
    Am_Value_List::Next(&local_88);
  } while( true );
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_load_sel_object_search,
                 (Am_Object cmd))
{
  Am_Object search_widget = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object sel_widget = search_widget.Get(Am_SELECTION_WIDGET);
  Am_Value_List slots_to_item = search_widget.Get(Am_SLOTS_TO_ITEMS);
  Am_Value_List sel_list = sel_widget.Get(Am_VALUE);
  Am_Object selected = sel_list.Get_First();
  Am_Value_List slots_to_save = selected.Get(Am_SLOTS_TO_SAVE);
  Am_Assoc as;
  Am_Am_Slot_Key key;
  Am_Object item;
  Am_Value v;
  bool set_on;
  for (slots_to_item.Start(); !slots_to_item.Last(); slots_to_item.Next()) {
    as = slots_to_item.Get();
    key = as.Value_1();
    set_on = true;
    if ((Am_Slot_Key)key == Am_PROTOTYPE)
      v = selected.Get_Prototype();
    else if (slots_to_save.Start_Member(key)) {
      v = selected.Peek(key);
      if (!v.Exists())
        v = 0; //supposed to be in this object, but invalid
    } else {
      set_on = false;
      v = selected.Peek(key);
    }
    item = as.Value_2();
    if (v.Exists()) {
      item.Get_Object(Am_USE_ITEM).Set(Am_VALUE, set_on);
      if ((Am_Slot_Key)key == Am_PROTOTYPE)
        set_type_of_search(item, v);
      else {
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUE, v);
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUES, v);
      }
    } else {
      item.Get_Object(Am_USE_ITEM).Set(Am_VALUE, false);
      if ((Am_Slot_Key)key != Am_PROTOTYPE)
        item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUE, "");
    }
  }
}